

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethercatmain.c
# Opt level: O0

void ecx_mbxerror(ecx_contextt *context,uint16 Slave,uint16 Detail)

{
  undefined1 local_30 [8];
  ec_errort Ec;
  uint16 Detail_local;
  uint16 Slave_local;
  ecx_contextt *context_local;
  
  Ec.field_6.field_1.ErrorCode = Detail;
  Ec.field_6.AbortCode._2_2_ = Slave;
  unique0x1000003e = context;
  local_30 = (undefined1  [8])osal_current_time();
  Ec.Time.sec._2_2_ = Ec.field_6.AbortCode._2_2_;
  Ec.Time.usec._0_2_ = 0;
  Ec.Time.usec._2_1_ = 0;
  Ec.Signal = '\t';
  Ec._9_1_ = 0;
  Ec.Slave = 0;
  Ec.Index = Ec.field_6.field_1.ErrorCode;
  ecx_pusherror(stack0xfffffffffffffff0,(ec_errort *)local_30);
  return;
}

Assistant:

static void ecx_mbxerror(ecx_contextt *context, uint16 Slave,uint16 Detail)
{
   ec_errort Ec;

   Ec.Time = osal_current_time();
   Ec.Slave = Slave;
   Ec.Index = 0;
   Ec.SubIdx = 0;
   Ec.Etype = EC_ERR_TYPE_MBX_ERROR;
   Ec.ErrorCode = Detail;
   ecx_pusherror(context, &Ec);
}